

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWeakReference.h
# Opt level: O0

bool __thiscall
Memory::WeakReferenceHashTable<PrimePolicy>::FindOrAdd
          (WeakReferenceHashTable<PrimePolicy> *this,char *strongReference,Recycler *recycler,
          RecyclerWeakReferenceBase **ppWeakRef)

{
  code *pcVar1;
  bool bVar2;
  hash_t targetBucket_00;
  undefined4 *puVar3;
  RecyclerWeakReferenceBase *pRVar4;
  RecyclerWeakReferenceBase *pRVar5;
  RecyclerWeakReferenceBase *entry;
  uint targetBucket;
  RecyclerWeakReferenceBase **ppWeakRef_local;
  Recycler *recycler_local;
  char *strongReference_local;
  WeakReferenceHashTable<PrimePolicy> *this_local;
  
  if (ppWeakRef == (RecyclerWeakReferenceBase **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWeakReference.h"
                       ,0x95,"(ppWeakRef)","ppWeakRef");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  targetBucket_00 = HashKeyToBucket(this,strongReference,this->size);
  pRVar4 = FindEntry(this,strongReference,targetBucket_00);
  if (pRVar4 == (RecyclerWeakReferenceBase *)0x0) {
    pRVar5 = Create(this,strongReference,targetBucket_00,recycler);
    *ppWeakRef = pRVar5;
  }
  else {
    *ppWeakRef = pRVar4;
  }
  return pRVar4 == (RecyclerWeakReferenceBase *)0x0;
}

Assistant:

bool FindOrAdd(char* strongReference, Recycler *recycler, RecyclerWeakReferenceBase **ppWeakRef)
    {
        Assert(ppWeakRef);

        uint targetBucket = HashKeyToBucket(strongReference, size);
        RecyclerWeakReferenceBase* entry = FindEntry(strongReference, targetBucket);
        if (entry != nullptr)
        {
            *ppWeakRef = entry;
            return false;
        }

        entry = Create(strongReference, targetBucket, recycler);
        *ppWeakRef = entry;
        return true;
    }